

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<double>::SolveEigensystemJacobi
          (TPZMatrix<double> *this,int64_t *numiterations,REAL *tol,TPZVec<double> *Eigenvalues,
          TPZFMatrix<double> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  int64_t i;
  long lVar9;
  int64_t size;
  int64_t j;
  ulong uVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar11;
  TPZFNMatrix<9,_double> Matrix_1;
  TPZFNMatrix<9,_double> Matrix;
  double local_478;
  double local_458;
  TPZFMatrix<double> local_3f0;
  double local_360 [4];
  _func_int **local_340;
  _func_int **local_338;
  TPZFMatrix<double> local_330;
  double local_2a0 [10];
  TPZFMatrix<double> local_250;
  double local_1c0 [4];
  TPZFMatrix<double> local_1a0;
  double local_110 [10];
  TPZFMatrix<double> local_c0;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  uVar3 = (this->super_TPZBaseMatrix).fRow;
  local_1a0.fElem = local_110;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_338 = (_func_int **)&PTR__TPZFMatrix_01816238;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_1a0.fSize = 9;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar3;
  local_1a0.fGiven = local_1a0.fElem;
  TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
  local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
  local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1a0.fWork.fStore = (double *)0x0;
  local_1a0.fWork.fNElements = 0;
  local_1a0.fWork.fNAlloc = 0;
  pdVar8 = (double *)0x0;
  if ((uVar3 != 0) && (uVar7 = uVar3 * uVar3, pdVar8 = local_1a0.fElem, 9 < uVar7)) {
    pdVar8 = (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
  }
  local_1a0.fElem = pdVar8;
  local_340 = (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  if (0 < (long)uVar3) {
    uVar7 = 0;
    do {
      uVar10 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,uVar7,uVar10);
        if ((local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
           (local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_1a0.fElem[local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar10 + uVar7]
             = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  bVar5 = SolveEigenvaluesJacobi(&local_1a0.super_TPZMatrix<double>,numiterations,tol,Eigenvalues);
  if (bVar5) {
    local_3f0.fElem = local_360;
    local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018454a8;
    local_3f0.fSize = 3;
    local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
    local_3f0.fGiven = local_3f0.fElem;
    TPZVec<int>::TPZVec(&local_3f0.fPivot.super_TPZVec<int>,0);
    local_3f0.fPivot.super_TPZVec<int>.fStore = local_3f0.fPivot.fExtAlloc;
    local_3f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_3f0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_3f0.fWork.fStore = (double *)0x0;
    local_3f0.fWork.fNElements = 0;
    local_3f0.fWork.fNAlloc = 0;
    if (uVar3 == 0) {
      local_3f0.fElem = (double *)0x0;
    }
    else if (3 < (long)uVar3) {
      local_3f0.fElem = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    }
    local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018451b8;
    TPZFMatrix<double>::operator=(&local_3f0,0.0);
    local_250.fElem = local_1c0;
    local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018454a8;
    local_250.fSize = 3;
    local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
    local_250.fGiven = local_250.fElem;
    TPZVec<int>::TPZVec(&local_250.fPivot.super_TPZVec<int>,0);
    local_250.fPivot.super_TPZVec<int>.fStore = local_250.fPivot.fExtAlloc;
    local_250.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_250.fPivot.super_TPZVec<int>.fNElements = 0;
    local_250.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_250.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_250.fWork.fStore = (double *)0x0;
    local_250.fWork.fNElements = 0;
    local_250.fWork.fNAlloc = 0;
    if (uVar3 == 0) {
      local_250.fElem = (double *)0x0;
    }
    else if (3 < (long)uVar3) {
      local_250.fElem = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    }
    local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018451b8;
    TPZFMatrix<double>::operator=(&local_250,0.0);
    (*(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,uVar3,uVar3);
    (*(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    if (0 < (long)uVar3) {
      uVar7 = 0;
      do {
        uVar10 = 0;
        do {
          iVar6 = rand();
          local_3f0.fElem[uVar10] = (double)iVar6;
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
        TPZFMatrix<double>::TPZFMatrix(&local_c0,this);
        local_330.fElem = local_2a0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_338;
        local_330.fSize = 9;
        local_330.fGiven = local_330.fElem;
        TPZVec<int>::TPZVec(&local_330.fPivot.super_TPZVec<int>,0);
        local_330.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_330.fPivot.super_TPZVec<int>.fStore = local_330.fPivot.fExtAlloc;
        local_330.fPivot.super_TPZVec<int>.fNElements = 0;
        local_330.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_330.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        local_330.fWork.fNAlloc = 0;
        local_330.fWork.fStore = (double *)0x0;
        local_330.fWork.fNElements = 0;
        local_330.fElem = (double *)0x0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_340;
        TPZFMatrix<double>::operator=(&local_330,&local_c0);
        TPZFMatrix<double>::~TPZFMatrix(&local_c0);
        dVar11 = ReturnNearestValue(Eigenvalues->fStore[uVar7],Eigenvalues,1e-05);
        dVar11 = ABS(dVar11 - Eigenvalues->fStore[uVar7]);
        if (dVar11 <= 1e-05) {
          uVar10 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,uVar10,uVar10);
            local_330.fElem
            [(uVar10 & 0xffffffff) * local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
             uVar10] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) -
                       (Eigenvalues->fStore[uVar7] + -0.01);
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
        }
        else {
          uVar10 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,uVar10,uVar10);
            local_330.fElem
            [(uVar10 & 0xffffffff) * local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
             uVar10] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) -
                       (dVar11 * -0.01 + Eigenvalues->fStore[uVar7]);
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
        }
        local_478 = 0.0;
        uVar10 = 0;
        do {
          if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
             (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_478 = local_478 + ABS(local_3f0.fElem[uVar10]) * ABS(local_3f0.fElem[uVar10]);
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
        if (local_478 < 0.0) {
          local_478 = sqrt(local_478);
        }
        else {
          local_478 = SQRT(local_478);
        }
        uVar10 = 0;
        do {
          if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
             (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_3f0.fElem[uVar10] = local_3f0.fElem[uVar10] / local_478;
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
        if (-1 < lVar2 && dVar1 < 10.0) {
          lVar9 = 0;
          do {
            uVar10 = 0;
            do {
              if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_250.fElem[uVar10] = local_3f0.fElem[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
            iVar6 = (*local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&local_330);
            if (iVar6 != 0) {
              Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar6 = (*local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&local_330);
            if (iVar6 != 0) {
              (*local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x43])(&local_330);
            }
            local_478 = 0.0;
            uVar10 = 0;
            do {
              if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_478 = local_478 + ABS(local_3f0.fElem[uVar10]) * ABS(local_3f0.fElem[uVar10]);
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
            if (local_478 < 0.0) {
              local_478 = sqrt(local_478);
            }
            else {
              local_478 = SQRT(local_478);
            }
            local_458 = 0.0;
            uVar10 = 0;
            do {
              if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3f0.fElem[uVar10] = local_3f0.fElem[uVar10] / local_478;
              if ((local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                 (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_458 = local_458 +
                          ABS((local_250.fElem[uVar10] - local_3f0.fElem[uVar10]) *
                              (local_250.fElem[uVar10] - local_3f0.fElem[uVar10]));
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
            if (local_458 < 0.0) {
              local_458 = sqrt(local_458);
            }
            else {
              local_458 = SQRT(local_458);
            }
          } while ((dVar1 < local_458) && (bVar4 = lVar9 < lVar2, lVar9 = lVar9 + 1, bVar4));
        }
        uVar10 = 0;
        do {
          if ((local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
             (local_3f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar9 <= (long)uVar7) ||
             ((Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Eigenvectors->fElem[lVar9 * uVar10 + uVar7] =
               (double)(~-(ulong)(ABS(local_3f0.fElem[uVar10]) < 1e-05) &
                       (ulong)local_3f0.fElem[uVar10]);
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
        TPZFMatrix<double>::~TPZFMatrix(&local_330,&PTR_PTR_01816200);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_250,&PTR_PTR_01845470);
    TPZFMatrix<double>::~TPZFMatrix(&local_3f0,&PTR_PTR_01845470);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1a0,&PTR_PTR_01816200);
  return bVar5;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}